

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

void initializer2(C_Parser *parser,C_Token **rest,C_Token *tok,Initializer *init)

{
  _Bool _Var1;
  C_Node *pCVar2;
  C_Token *pCVar3;
  C_Node *expr;
  Initializer *init_local;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  init_local = (Initializer *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  if ((init->ty->kind == TY_ARRAY) && (tok->kind == TK_STR)) {
    string_initializer(parser,rest,tok,init);
  }
  else if (init->ty->kind == TY_ARRAY) {
    _Var1 = C_equal(tok,"{");
    if (_Var1) {
      array_initializer1((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)init_local,init);
    }
    else {
      array_initializer2((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)init_local,init,0);
    }
  }
  else if (init->ty->kind == TY_STRUCT) {
    _Var1 = C_equal(tok,"{");
    if (_Var1) {
      struct_initializer1((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)init_local,init);
    }
    else {
      pCVar2 = assign((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)init_local);
      C_add_type((C_Parser *)rest_local,pCVar2);
      if (pCVar2->ty->kind == TY_STRUCT) {
        init->expr = pCVar2;
      }
      else {
        struct_initializer2((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)init_local,init,
                            init->ty->members);
      }
    }
  }
  else if (init->ty->kind == TY_UNION) {
    union_initializer(parser,rest,tok,init);
  }
  else {
    _Var1 = C_equal(tok,"{");
    if (_Var1) {
      initializer2((C_Parser *)rest_local,(C_Token **)&init_local,(C_Token *)init_local->ty,init);
      pCVar3 = C_skip((C_Parser *)rest_local,(C_Token *)init_local,"}");
      *(C_Token **)tok_local = pCVar3;
    }
    else {
      pCVar2 = assign((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)init_local);
      init->expr = pCVar2;
    }
  }
  return;
}

Assistant:

static void initializer2(C_Parser *parser, C_Token **rest, C_Token *tok, Initializer *init) {
  if (init->ty->kind == TY_ARRAY && tok->kind == TK_STR) {
    string_initializer(parser, rest, tok, init);
    return;
  }

  if (init->ty->kind == TY_ARRAY) {
    if (C_equal(tok, "{"))
      array_initializer1(parser, rest, tok, init);
    else
      array_initializer2(parser, rest, tok, init, 0);
    return;
  }

  if (init->ty->kind == TY_STRUCT) {
    if (C_equal(tok, "{")) {
      struct_initializer1(parser, rest, tok, init);
      return;
    }

    // A struct can be initialized with another struct. E.g.
    // `struct T x = y;` where y is a variable of type `struct T`.
    // Handle that case first.
    C_Node *expr = assign(parser, rest, tok);
    C_add_type(parser, expr);
    if (expr->ty->kind == TY_STRUCT) {
      init->expr = expr;
      return;
    }

    struct_initializer2(parser, rest, tok, init, init->ty->members);
    return;
  }

  if (init->ty->kind == TY_UNION) {
    union_initializer(parser, rest, tok, init);
    return;
  }

  if (C_equal(tok, "{")) {
    // An initializer for a scalar variable can be surrounded by
    // braces. E.g. `int x = {3};`. Handle that case.
    initializer2(parser, &tok, tok->next, init);
    *rest = C_skip(parser, tok, "}");
    return;
  }

  init->expr = assign(parser, rest, tok);
}